

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::smearScalar(Builder *this,Decoration precision,Id scalar,Id vectorType)

{
  Instruction *pIVar1;
  void *pvVar2;
  bool specConstant;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  Op OVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  allocator_type local_59;
  Decoration local_58;
  Id local_54;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[scalar];
  if (pIVar1 == (Instruction *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = pIVar1->typeId;
  }
  local_54 = scalar;
  uVar3 = getNumTypeConstituents(this,IVar5);
  if (uVar3 != 1) {
    __assert_fail("getNumComponents(scalar) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbed,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[scalar];
  if (pIVar1 == (Instruction *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = pIVar1->typeId;
  }
  IVar4 = getScalarTypeId(this,vectorType);
  if (IVar5 != IVar4) {
    __assert_fail("getTypeId(scalar) == getScalarTypeId(vectorType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbee,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  uVar3 = getNumTypeConstituents(this,vectorType);
  if ((uVar3 == 1) &&
     ((this->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[vectorType]->opCode != OpTypeCooperativeVectorNV)) {
    return scalar;
  }
  local_58 = precision;
  if (this->generatingOpCodeForSpecConst == true) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,(long)(int)uVar3,&local_54,&local_59);
    specConstant = isSpecConstant(this,local_54);
    IVar5 = makeCompositeConstant(this,vectorType,&local_48,specConstant);
    this_00._M_head_impl =
         (this->module).idToInstruction.
         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
         super__Vector_impl_data._M_start[IVar5];
    pvVar2 = (void *)CONCAT44(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2)
      ;
    }
    goto LAB_003d86a5;
  }
  if (this->useReplicatedComposites == false) {
    OVar6 = OpCompositeConstruct;
    if ((0 < (int)uVar3) &&
       ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[vectorType]->opCode == OpTypeCooperativeVectorNV))
    goto LAB_003d85c9;
  }
  else if ((int)uVar3 < 1) {
    OVar6 = OpCompositeConstruct;
  }
  else {
LAB_003d85c9:
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x1788;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_48);
    addExtension(this,"SPV_EXT_replicated_composites");
    uVar3 = 1;
    OVar6 = OpCompositeConstructReplicateEXT;
  }
  this_00._M_head_impl = (Instruction *)operator_new(0x60);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  (this_00._M_head_impl)->resultId = IVar5;
  (this_00._M_head_impl)->typeId = vectorType;
  (this_00._M_head_impl)->opCode = OVar6;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this_00._M_head_impl)->block = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&(this_00._M_head_impl)->operands,(long)(int)uVar3);
  std::vector<bool,_std::allocator<bool>_>::reserve
            (&(this_00._M_head_impl)->idOperand,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    do {
      Instruction::addIdOperand(this_00._M_head_impl,scalar);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  local_50._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)this_00._M_head_impl;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
LAB_003d86a5:
  IVar5 = *(Id *)((long)this_00._M_head_impl + 8);
  if ((local_58 != DecorationMax) && (IVar5 != 0)) {
    addDecoration(this,IVar5,local_58,-1);
  }
  return IVar5;
}

Assistant:

Id Builder::smearScalar(Decoration precision, Id scalar, Id vectorType)
{
    assert(getNumComponents(scalar) == 1);
    assert(getTypeId(scalar) == getScalarTypeId(vectorType));

    int numComponents = getNumTypeComponents(vectorType);
    if (numComponents == 1 && !isCooperativeVectorType(vectorType))
        return scalar;

    Instruction* smear = nullptr;
    if (generatingOpCodeForSpecConst) {
        auto members = std::vector<spv::Id>(numComponents, scalar);
        // Sometime even in spec-constant-op mode, the temporary vector created by
        // promoting a scalar might not be a spec constant. This should depend on
        // the scalar.
        // e.g.:
        //  const vec2 spec_const_result = a_spec_const_vec2 + a_front_end_const_scalar;
        // In such cases, the temporary vector created from a_front_end_const_scalar
        // is not a spec constant vector, even though the binary operation node is marked
        // as 'specConstant' and we are in spec-constant-op mode.
        auto result_id = makeCompositeConstant(vectorType, members, isSpecConstant(scalar));
        smear = module.getInstruction(result_id);
    } else {
        bool replicate = (useReplicatedComposites || isCooperativeVectorType(vectorType)) && (numComponents > 0);

        if (replicate) {
            numComponents = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }

        Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

        smear = new Instruction(getUniqueId(), vectorType, opcode);
        smear->reserveOperands(numComponents);
        for (int c = 0; c < numComponents; ++c)
            smear->addIdOperand(scalar);
        addInstruction(std::unique_ptr<Instruction>(smear));
    }

    return setPrecision(smear->getResultId(), precision);
}